

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

TextureFormat deqp::gles3::Functional::mapGLUnsizedInternalFormat(deUint32 internalFormat)

{
  InternalError *this;
  deUint64 local_b8;
  string local_b0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  deUint32 local_14;
  TextureFormat TStack_10;
  deUint32 internalFormat_local;
  
  local_14 = internalFormat;
  switch(internalFormat) {
  case 0x1906:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,A,UNORM_INT8);
    break;
  case 0x1907:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_INT8);
    break;
  case 0x1908:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT8);
    break;
  case 0x1909:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,L,UNORM_INT8);
    break;
  case 0x190a:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,LA,UNORM_INT8);
    break;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Can\'t map GL unsized internal format (",&local_79);
    local_b8 = (deUint64)tcu::toHex<unsigned_int>(local_14);
    tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_b0,&local_b8);
    std::operator+(&local_58,&local_78,&local_b0);
    std::operator+(&local_38,&local_58,") to texture format");
    tcu::InternalError::InternalError(this,&local_38);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return TStack_10;
}

Assistant:

tcu::TextureFormat mapGLUnsizedInternalFormat (deUint32 internalFormat)
{
	using tcu::TextureFormat;
	switch (internalFormat)
	{
		case GL_ALPHA:				return TextureFormat(TextureFormat::A,		TextureFormat::UNORM_INT8);
		case GL_LUMINANCE:			return TextureFormat(TextureFormat::L,		TextureFormat::UNORM_INT8);
		case GL_LUMINANCE_ALPHA:	return TextureFormat(TextureFormat::LA,		TextureFormat::UNORM_INT8);
		case GL_RGB:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
		case GL_RGBA:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
		default:
			throw tcu::InternalError(string("Can't map GL unsized internal format (") + tcu::toHex(internalFormat).toString() + ") to texture format");
	}
}